

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurface.cpp
# Opt level: O1

shared_ptr<chrono::ChMaterialSurface> __thiscall
chrono::ChMaterialSurface::DefaultMaterial(ChMaterialSurface *this,ChContactMethod contact_method)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<chrono::ChMaterialSurface> sVar1;
  undefined1 local_29;
  ChMaterialSurfaceSMC *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if (contact_method == SMC) {
    local_28 = (ChMaterialSurfaceSMC *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChMaterialSurfaceSMC,std::allocator<chrono::ChMaterialSurfaceSMC>>
              (&local_20,&local_28,(allocator<chrono::ChMaterialSurfaceSMC> *)&local_29);
    in_RDX._M_pi = extraout_RDX_00;
  }
  else {
    if (contact_method != NSC) {
      this->_vptr_ChMaterialSurface = (_func_int **)0x0;
      this->static_friction = 0.0;
      this->sliding_friction = 0.0;
      goto LAB_00582dd9;
    }
    local_28 = (ChMaterialSurfaceSMC *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
              (&local_20,(ChMaterialSurfaceNSC **)&local_28,
               (allocator<chrono::ChMaterialSurfaceNSC> *)&local_29);
    in_RDX._M_pi = extraout_RDX;
  }
  this->_vptr_ChMaterialSurface = (_func_int **)local_28;
  this->static_friction = 0.0;
  this->sliding_friction = 0.0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->static_friction = local_20._M_pi;
LAB_00582dd9:
  sVar1.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<chrono::ChMaterialSurface>)
         sVar1.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChMaterialSurface> ChMaterialSurface::DefaultMaterial(ChContactMethod contact_method) {
    switch (contact_method) {
        case ChContactMethod::NSC:
            return chrono_types::make_shared<ChMaterialSurfaceNSC>();
        case ChContactMethod::SMC:
            return chrono_types::make_shared<ChMaterialSurfaceSMC>();
    }
    return nullptr;
}